

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

hts_idx_t * bcf_index(htsFile *fp,int min_shift)

{
  uint *puVar1;
  bcf_hdr_t *h;
  ulong uVar2;
  hts_idx_t *idx;
  bcf1_t *v;
  long lVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int n_lvls;
  
  h = bcf_hdr_read(fp);
  iVar4 = 0;
  if (h == (bcf_hdr_t *)0x0) {
    return (hts_idx_t *)0x0;
  }
  if ((long)h->n[1] < 1) {
LAB_00121a2b:
    lVar3 = (long)(1 << ((byte)min_shift & 0x1f));
    lVar5 = 0x800000ff;
  }
  else {
    lVar5 = 0;
    iVar4 = 0;
    uVar2 = 0;
    do {
      puVar1 = *(uint **)((long)&h->id[1]->val + lVar5);
      if (puVar1 != (uint *)0x0) {
        uVar6 = (ulong)*puVar1;
        if (uVar2 <= uVar6) {
          uVar2 = uVar6;
        }
        iVar4 = iVar4 + 1;
      }
      lVar5 = lVar5 + 0x10;
    } while ((long)h->n[1] * 0x10 != lVar5);
    if (uVar2 == 0) goto LAB_00121a2b;
    lVar5 = uVar2 + 0x100;
    lVar3 = (long)(1 << ((byte)min_shift & 0x1f));
    n_lvls = 0;
    if (lVar5 <= lVar3) goto LAB_00121a4b;
  }
  n_lvls = 0;
  do {
    n_lvls = n_lvls + 1;
    lVar3 = lVar3 * 8;
  } while (lVar3 < lVar5);
LAB_00121a4b:
  idx = hts_idx_init(iVar4,0,(ulong)(ushort)((fp->fp).bgzf)->block_offset |
                             ((fp->fp).bgzf)->block_address << 0x10,min_shift,n_lvls);
  v = (bcf1_t *)calloc(1,200);
  do {
    iVar4 = bcf_read(fp,h,v);
    if (iVar4 < 0) {
      hts_idx_finish(idx,(ulong)(ushort)((fp->fp).bgzf)->block_offset |
                         ((fp->fp).bgzf)->block_address << 0x10);
      bcf_empty1(v);
      free(v);
      bcf_hdr_destroy(h);
      return idx;
    }
    iVar4 = hts_idx_push(idx,v->rid,v->pos,v->rlen + v->pos,
                         (ulong)(ushort)((fp->fp).bgzf)->block_offset |
                         ((fp->fp).bgzf)->block_address << 0x10,1);
  } while (-1 < iVar4);
  bcf_empty1(v);
  free(v);
  hts_idx_destroy(idx);
  return (hts_idx_t *)0x0;
}

Assistant:

hts_idx_t *bcf_index(htsFile *fp, int min_shift)
{
    int n_lvls, i;
    bcf1_t *b;
    hts_idx_t *idx;
    bcf_hdr_t *h;
    int64_t max_len = 0, s;
    h = bcf_hdr_read(fp);
    if ( !h ) return NULL;
    int nids = 0;
    for (i = 0; i < h->n[BCF_DT_CTG]; ++i)
    {
        if ( !h->id[BCF_DT_CTG][i].val ) continue;
        if ( max_len < h->id[BCF_DT_CTG][i].val->info[0] ) max_len = h->id[BCF_DT_CTG][i].val->info[0];
        nids++;
    }
    if ( !max_len ) max_len = ((int64_t)1<<31) - 1;  // In case contig line is broken.
    max_len += 256;
    for (n_lvls = 0, s = 1<<min_shift; max_len > s; ++n_lvls, s <<= 3);
    idx = hts_idx_init(nids, HTS_FMT_CSI, bgzf_tell(fp->fp.bgzf), min_shift, n_lvls);
    b = bcf_init1();
    while (bcf_read1(fp,h, b) >= 0) {
        int ret;
        ret = hts_idx_push(idx, b->rid, b->pos, b->pos + b->rlen, bgzf_tell(fp->fp.bgzf), 1);
        if (ret < 0)
        {
            bcf_destroy1(b);
            hts_idx_destroy(idx);
            return NULL;
        }
    }
    hts_idx_finish(idx, bgzf_tell(fp->fp.bgzf));
    bcf_destroy1(b);
    bcf_hdr_destroy(h);
    return idx;
}